

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_8.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  uint uVar12;
  void *pvVar13;
  parasail_matrix_t *ppVar14;
  int *piVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  char cVar19;
  char cVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  parasail_result_t *ppVar24;
  __m128i *ptr;
  __m128i *palVar25;
  __m128i *ptr_00;
  int8_t *ptr_01;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  bool bVar39;
  undefined4 uVar40;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i_8_t A;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  long local_198;
  __m128i *local_180;
  ulong local_150;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  char cVar46;
  char cVar48;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse2_128_8_cold_8();
  }
  else {
    pvVar13 = (profile->profile8).score;
    if (pvVar13 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse2_128_8_cold_7();
    }
    else {
      ppVar14 = profile->matrix;
      if (ppVar14 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse2_128_8_cold_6();
      }
      else {
        uVar12 = profile->s1Len;
        if ((int)uVar12 < 1) {
          parasail_nw_table_striped_profile_sse2_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse2_128_8_cold_4();
        }
        else {
          uVar34 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse2_128_8_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse2_128_8_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse2_128_8_cold_1();
          }
          else {
            iVar38 = uVar12 - 1;
            uVar31 = (ulong)uVar12 + 0xf >> 4;
            iVar30 = (int)uVar31;
            iVar29 = -open;
            iVar21 = ppVar14->min;
            uVar23 = (uint)(byte)-(char)iVar21;
            if (iVar21 != iVar29 && SBORROW4(iVar21,iVar29) == iVar21 + open < 0) {
              uVar23 = open;
            }
            cVar19 = '~' - (char)ppVar14->max;
            ppVar24 = parasail_result_new_table1((uint)((ulong)uVar12 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar24 != (parasail_result_t *)0x0) {
              ppVar24->flag = ppVar24->flag | 0x10120801;
              ptr = parasail_memalign___m128i(0x10,uVar31);
              palVar25 = parasail_memalign___m128i(0x10,uVar31);
              ptr_00 = parasail_memalign___m128i(0x10,uVar31);
              ptr_01 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar25 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar21 = s2Len + -1;
                iVar22 = 0xf - iVar38 / iVar30;
                uVar47 = (undefined1)((uint)open >> 0x18);
                uVar45 = (undefined1)((uint)open >> 0x10);
                uVar44 = (undefined1)((uint)open >> 8);
                auVar41._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar47,uVar47),uVar45),CONCAT14(uVar45,open))
                          >> 0x20);
                auVar41[3] = uVar44;
                auVar41[2] = uVar44;
                auVar41[0] = (undefined1)open;
                auVar41[1] = auVar41[0];
                auVar41._8_8_ = 0;
                auVar41 = pshuflw(auVar41,auVar41,0);
                uVar40 = auVar41._0_4_;
                auVar50._4_4_ = uVar40;
                auVar50._0_4_ = uVar40;
                auVar50._8_4_ = uVar40;
                auVar50._12_4_ = uVar40;
                uVar47 = (undefined1)((uint)gap >> 0x18);
                uVar45 = (undefined1)((uint)gap >> 0x10);
                uVar44 = (undefined1)((uint)gap >> 8);
                auVar49._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar47,uVar47),uVar45),CONCAT14(uVar45,gap))
                          >> 0x20);
                auVar49[3] = uVar44;
                auVar49[2] = uVar44;
                auVar49[0] = (undefined1)gap;
                auVar49[1] = auVar49[0];
                auVar49._8_8_ = 0;
                auVar41 = pshuflw(auVar49,auVar49,0);
                uVar40 = auVar41._0_4_;
                cVar20 = (char)uVar23 + -0x7f;
                auVar41 = ZEXT216(CONCAT11(cVar20,cVar20));
                auVar41 = pshuflw(auVar41,auVar41,0);
                auVar42._0_4_ = auVar41._0_4_;
                auVar42._4_4_ = auVar42._0_4_;
                auVar42._8_4_ = auVar42._0_4_;
                auVar42._12_4_ = auVar42._0_4_;
                auVar49 = ZEXT216(CONCAT11(cVar19,cVar19));
                auVar49 = pshuflw(auVar49,auVar49,0);
                auVar66._0_4_ = auVar49._0_4_;
                auVar66._4_4_ = auVar66._0_4_;
                auVar66._8_4_ = auVar66._0_4_;
                auVar66._12_4_ = auVar66._0_4_;
                lVar28 = (long)iVar29;
                uVar32 = 0;
                do {
                  lVar36 = 0;
                  lVar35 = lVar28;
                  do {
                    uVar44 = 0x80;
                    if (-0x80 < lVar35) {
                      uVar44 = (undefined1)lVar35;
                    }
                    *(undefined1 *)((long)&local_48 + lVar36) = uVar44;
                    lVar37 = lVar35 - (ulong)(uint)open;
                    if (lVar37 < -0x7f) {
                      lVar37 = -0x80;
                    }
                    *(char *)((long)&local_58 + lVar36) = (char)lVar37;
                    lVar36 = lVar36 + 1;
                    lVar35 = lVar35 - uVar31 * (uint)gap;
                  } while (lVar36 != 0x10);
                  ptr[uVar32][0] = local_48;
                  ptr[uVar32][1] = lStack_40;
                  ptr_00[uVar32][0] = local_58;
                  ptr_00[uVar32][1] = lStack_50;
                  uVar32 = uVar32 + 1;
                  lVar28 = lVar28 - (ulong)(uint)gap;
                } while (uVar32 != uVar31);
                *ptr_01 = '\0';
                uVar32 = 1;
                if (1 < s2Len) {
                  uVar32 = uVar34;
                }
                uVar26 = 0;
                do {
                  iVar27 = -0x80;
                  if (-0x80 < iVar29) {
                    iVar27 = iVar29;
                  }
                  ptr_01[uVar26 + 1] = (int8_t)iVar27;
                  auVar43 = _DAT_008d0a10;
                  iVar29 = iVar29 - gap;
                  uVar26 = uVar26 + 1;
                } while (uVar32 != uVar26);
                uVar32 = 1;
                if (1 < s2Len) {
                  uVar32 = uVar34;
                }
                lVar35 = uVar31 * uVar34;
                lVar36 = (ulong)(iVar30 + (uint)(iVar30 == 0)) << 4;
                lVar28 = 0;
                uVar26 = 0;
                auVar51 = auVar42;
                do {
                  local_180 = ptr;
                  ptr = palVar25;
                  iVar29 = ppVar14->mapper[(byte)s2[uVar26]];
                  uVar18 = local_180[iVar30 - 1][0];
                  auVar57._0_8_ = uVar18 << 8;
                  auVar57._8_8_ = local_180[iVar30 - 1][1] << 8 | uVar18 >> 0x38;
                  auVar57 = ~auVar43 & ZEXT116((byte)ptr_01[uVar26]) | auVar57;
                  lVar37 = 0;
                  auVar55 = auVar42;
                  local_198 = lVar28;
                  do {
                    auVar58 = paddsb(auVar57,*(undefined1 (*) [16])
                                              ((long)pvVar13 + lVar37 + uVar31 * (long)iVar29 * 0x10
                                              ));
                    auVar57 = *(undefined1 (*) [16])((long)*ptr_00 + lVar37);
                    auVar64[0] = -(auVar57[0] < auVar58[0]);
                    auVar64[1] = -(auVar57[1] < auVar58[1]);
                    auVar64[2] = -(auVar57[2] < auVar58[2]);
                    auVar64[3] = -(auVar57[3] < auVar58[3]);
                    auVar64[4] = -(auVar57[4] < auVar58[4]);
                    auVar64[5] = -(auVar57[5] < auVar58[5]);
                    auVar64[6] = -(auVar57[6] < auVar58[6]);
                    auVar64[7] = -(auVar57[7] < auVar58[7]);
                    auVar64[8] = -(auVar57[8] < auVar58[8]);
                    auVar64[9] = -(auVar57[9] < auVar58[9]);
                    auVar64[10] = -(auVar57[10] < auVar58[10]);
                    auVar64[0xb] = -(auVar57[0xb] < auVar58[0xb]);
                    auVar64[0xc] = -(auVar57[0xc] < auVar58[0xc]);
                    auVar64[0xd] = -(auVar57[0xd] < auVar58[0xd]);
                    auVar64[0xe] = -(auVar57[0xe] < auVar58[0xe]);
                    auVar64[0xf] = -(auVar57[0xf] < auVar58[0xf]);
                    auVar58 = ~auVar64 & auVar57 | auVar58 & auVar64;
                    auVar59[0] = -(auVar55[0] < auVar58[0]);
                    auVar59[1] = -(auVar55[1] < auVar58[1]);
                    auVar59[2] = -(auVar55[2] < auVar58[2]);
                    auVar59[3] = -(auVar55[3] < auVar58[3]);
                    auVar59[4] = -(auVar55[4] < auVar58[4]);
                    auVar59[5] = -(auVar55[5] < auVar58[5]);
                    auVar59[6] = -(auVar55[6] < auVar58[6]);
                    auVar59[7] = -(auVar55[7] < auVar58[7]);
                    auVar59[8] = -(auVar55[8] < auVar58[8]);
                    auVar59[9] = -(auVar55[9] < auVar58[9]);
                    auVar59[10] = -(auVar55[10] < auVar58[10]);
                    auVar59[0xb] = -(auVar55[0xb] < auVar58[0xb]);
                    auVar59[0xc] = -(auVar55[0xc] < auVar58[0xc]);
                    auVar59[0xd] = -(auVar55[0xd] < auVar58[0xd]);
                    auVar59[0xe] = -(auVar55[0xe] < auVar58[0xe]);
                    auVar59[0xf] = -(auVar55[0xf] < auVar58[0xf]);
                    auVar58 = ~auVar59 & auVar55 | auVar58 & auVar59;
                    *(undefined1 (*) [16])((long)*ptr + lVar37) = auVar58;
                    piVar15 = ((ppVar24->field_4).rowcols)->score_row;
                    cVar19 = *(char *)((long)*ptr + lVar37 + 1);
                    cVar20 = *(char *)((long)*ptr + lVar37 + 2);
                    cVar46 = *(char *)((long)*ptr + lVar37 + 3);
                    cVar48 = *(char *)((long)*ptr + lVar37 + 4);
                    cVar1 = *(char *)((long)*ptr + lVar37 + 5);
                    cVar2 = *(char *)((long)*ptr + lVar37 + 6);
                    cVar3 = *(char *)((long)*ptr + lVar37 + 7);
                    cVar4 = *(char *)((long)*ptr + lVar37 + 8);
                    cVar5 = *(char *)((long)*ptr + lVar37 + 9);
                    cVar6 = *(char *)((long)*ptr + lVar37 + 10);
                    cVar7 = *(char *)((long)*ptr + lVar37 + 0xb);
                    cVar8 = *(char *)((long)*ptr + lVar37 + 0xc);
                    cVar9 = *(char *)((long)*ptr + lVar37 + 0xd);
                    cVar10 = *(char *)((long)*ptr + lVar37 + 0xe);
                    cVar11 = *(char *)((long)*ptr + lVar37 + 0xf);
                    *(int *)((long)piVar15 + local_198) = (int)*(char *)((long)*ptr + lVar37);
                    *(int *)((long)piVar15 + lVar35 * 4 + local_198) = (int)cVar19;
                    *(int *)((long)piVar15 + lVar35 * 8 + local_198) = (int)cVar20;
                    *(int *)((long)piVar15 + lVar35 * 0xc + local_198) = (int)cVar46;
                    *(int *)((long)piVar15 + lVar35 * 0x10 + local_198) = (int)cVar48;
                    *(int *)((long)piVar15 + lVar35 * 0x14 + local_198) = (int)cVar1;
                    *(int *)((long)piVar15 + lVar35 * 0x18 + local_198) = (int)cVar2;
                    *(int *)((long)piVar15 + lVar35 * 0x1c + local_198) = (int)cVar3;
                    *(int *)((long)piVar15 + lVar35 * 0x20 + local_198) = (int)cVar4;
                    *(int *)((long)piVar15 + lVar35 * 0x24 + local_198) = (int)cVar5;
                    *(int *)((long)piVar15 + lVar35 * 0x28 + local_198) = (int)cVar6;
                    *(int *)((long)piVar15 + lVar35 * 0x2c + local_198) = (int)cVar7;
                    *(int *)((long)piVar15 + lVar35 * 0x30 + local_198) = (int)cVar8;
                    *(int *)((long)piVar15 + lVar35 * 0x34 + local_198) = (int)cVar9;
                    *(int *)((long)piVar15 + lVar35 * 0x38 + local_198) = (int)cVar10;
                    *(int *)((long)piVar15 + lVar35 * 0x3c + local_198) = (int)cVar11;
                    auVar60[0] = -(auVar58[0] < auVar51[0]);
                    auVar60[1] = -(auVar58[1] < auVar51[1]);
                    auVar60[2] = -(auVar58[2] < auVar51[2]);
                    auVar60[3] = -(auVar58[3] < auVar51[3]);
                    auVar60[4] = -(auVar58[4] < auVar51[4]);
                    auVar60[5] = -(auVar58[5] < auVar51[5]);
                    auVar60[6] = -(auVar58[6] < auVar51[6]);
                    auVar60[7] = -(auVar58[7] < auVar51[7]);
                    auVar60[8] = -(auVar58[8] < auVar51[8]);
                    auVar60[9] = -(auVar58[9] < auVar51[9]);
                    auVar60[10] = -(auVar58[10] < auVar51[10]);
                    auVar60[0xb] = -(auVar58[0xb] < auVar51[0xb]);
                    auVar60[0xc] = -(auVar58[0xc] < auVar51[0xc]);
                    auVar60[0xd] = -(auVar58[0xd] < auVar51[0xd]);
                    auVar60[0xe] = -(auVar58[0xe] < auVar51[0xe]);
                    auVar60[0xf] = -(auVar58[0xf] < auVar51[0xf]);
                    auVar51 = ~auVar60 & auVar58 | auVar51 & auVar60;
                    auVar65[0] = -(auVar58[0] < auVar66[0]);
                    auVar65[1] = -(auVar58[1] < auVar66[1]);
                    auVar65[2] = -(auVar58[2] < auVar66[2]);
                    auVar65[3] = -(auVar58[3] < auVar66[3]);
                    auVar65[4] = -(auVar58[4] < auVar66[4]);
                    auVar65[5] = -(auVar58[5] < auVar66[5]);
                    auVar65[6] = -(auVar58[6] < auVar66[6]);
                    auVar65[7] = -(auVar58[7] < auVar66[7]);
                    auVar65[8] = -(auVar58[8] < auVar66[8]);
                    auVar65[9] = -(auVar58[9] < auVar66[9]);
                    auVar65[10] = -(auVar58[10] < auVar66[10]);
                    auVar65[0xb] = -(auVar58[0xb] < auVar66[0xb]);
                    auVar65[0xc] = -(auVar58[0xc] < auVar66[0xc]);
                    auVar65[0xd] = -(auVar58[0xd] < auVar66[0xd]);
                    auVar65[0xe] = -(auVar58[0xe] < auVar66[0xe]);
                    auVar65[0xf] = -(auVar58[0xf] < auVar66[0xf]);
                    auVar66 = ~auVar65 & auVar66 | auVar58 & auVar65;
                    auVar68[0] = -(auVar57[0] < auVar66[0]);
                    auVar68[1] = -(auVar57[1] < auVar66[1]);
                    auVar68[2] = -(auVar57[2] < auVar66[2]);
                    auVar68[3] = -(auVar57[3] < auVar66[3]);
                    auVar68[4] = -(auVar57[4] < auVar66[4]);
                    auVar68[5] = -(auVar57[5] < auVar66[5]);
                    auVar68[6] = -(auVar57[6] < auVar66[6]);
                    auVar68[7] = -(auVar57[7] < auVar66[7]);
                    auVar68[8] = -(auVar57[8] < auVar66[8]);
                    auVar68[9] = -(auVar57[9] < auVar66[9]);
                    auVar68[10] = -(auVar57[10] < auVar66[10]);
                    auVar68[0xb] = -(auVar57[0xb] < auVar66[0xb]);
                    auVar68[0xc] = -(auVar57[0xc] < auVar66[0xc]);
                    auVar68[0xd] = -(auVar57[0xd] < auVar66[0xd]);
                    auVar68[0xe] = -(auVar57[0xe] < auVar66[0xe]);
                    auVar68[0xf] = -(auVar57[0xf] < auVar66[0xf]);
                    auVar66 = ~auVar68 & auVar66 | auVar57 & auVar68;
                    auVar54[0] = -(auVar55[0] < auVar66[0]);
                    auVar54[1] = -(auVar55[1] < auVar66[1]);
                    auVar54[2] = -(auVar55[2] < auVar66[2]);
                    auVar54[3] = -(auVar55[3] < auVar66[3]);
                    auVar54[4] = -(auVar55[4] < auVar66[4]);
                    auVar54[5] = -(auVar55[5] < auVar66[5]);
                    auVar54[6] = -(auVar55[6] < auVar66[6]);
                    auVar54[7] = -(auVar55[7] < auVar66[7]);
                    auVar54[8] = -(auVar55[8] < auVar66[8]);
                    auVar54[9] = -(auVar55[9] < auVar66[9]);
                    auVar54[10] = -(auVar55[10] < auVar66[10]);
                    auVar54[0xb] = -(auVar55[0xb] < auVar66[0xb]);
                    auVar54[0xc] = -(auVar55[0xc] < auVar66[0xc]);
                    auVar54[0xd] = -(auVar55[0xd] < auVar66[0xd]);
                    auVar54[0xe] = -(auVar55[0xe] < auVar66[0xe]);
                    auVar54[0xf] = -(auVar55[0xf] < auVar66[0xf]);
                    auVar66 = ~auVar54 & auVar66 | auVar55 & auVar54;
                    auVar60 = psubsb(auVar58,auVar50);
                    auVar58._4_4_ = uVar40;
                    auVar58._0_4_ = uVar40;
                    auVar58._8_4_ = uVar40;
                    auVar58._12_4_ = uVar40;
                    auVar57 = psubsb(auVar57,auVar58);
                    auVar67[0] = -(auVar60[0] < auVar57[0]);
                    auVar67[1] = -(auVar60[1] < auVar57[1]);
                    auVar67[2] = -(auVar60[2] < auVar57[2]);
                    auVar67[3] = -(auVar60[3] < auVar57[3]);
                    auVar67[4] = -(auVar60[4] < auVar57[4]);
                    auVar67[5] = -(auVar60[5] < auVar57[5]);
                    auVar67[6] = -(auVar60[6] < auVar57[6]);
                    auVar67[7] = -(auVar60[7] < auVar57[7]);
                    auVar67[8] = -(auVar60[8] < auVar57[8]);
                    auVar67[9] = -(auVar60[9] < auVar57[9]);
                    auVar67[10] = -(auVar60[10] < auVar57[10]);
                    auVar67[0xb] = -(auVar60[0xb] < auVar57[0xb]);
                    auVar67[0xc] = -(auVar60[0xc] < auVar57[0xc]);
                    auVar67[0xd] = -(auVar60[0xd] < auVar57[0xd]);
                    auVar67[0xe] = -(auVar60[0xe] < auVar57[0xe]);
                    auVar67[0xf] = -(auVar60[0xf] < auVar57[0xf]);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar37) =
                         ~auVar67 & auVar60 | auVar57 & auVar67;
                    auVar16._4_4_ = uVar40;
                    auVar16._0_4_ = uVar40;
                    auVar16._8_4_ = uVar40;
                    auVar16._12_4_ = uVar40;
                    auVar57 = psubsb(auVar55,auVar16);
                    auVar55[0] = -(auVar60[0] < auVar57[0]);
                    auVar55[1] = -(auVar60[1] < auVar57[1]);
                    auVar55[2] = -(auVar60[2] < auVar57[2]);
                    auVar55[3] = -(auVar60[3] < auVar57[3]);
                    auVar55[4] = -(auVar60[4] < auVar57[4]);
                    auVar55[5] = -(auVar60[5] < auVar57[5]);
                    auVar55[6] = -(auVar60[6] < auVar57[6]);
                    auVar55[7] = -(auVar60[7] < auVar57[7]);
                    auVar55[8] = -(auVar60[8] < auVar57[8]);
                    auVar55[9] = -(auVar60[9] < auVar57[9]);
                    auVar55[10] = -(auVar60[10] < auVar57[10]);
                    auVar55[0xb] = -(auVar60[0xb] < auVar57[0xb]);
                    auVar55[0xc] = -(auVar60[0xc] < auVar57[0xc]);
                    auVar55[0xd] = -(auVar60[0xd] < auVar57[0xd]);
                    auVar55[0xe] = -(auVar60[0xe] < auVar57[0xe]);
                    auVar55[0xf] = -(auVar60[0xf] < auVar57[0xf]);
                    auVar55 = ~auVar55 & auVar60 | auVar57 & auVar55;
                    auVar57 = *(undefined1 (*) [16])((long)*local_180 + lVar37);
                    lVar37 = lVar37 + 0x10;
                    local_198 = local_198 + uVar34 * 4;
                  } while (lVar36 != lVar37);
                  uVar12 = 0;
                  do {
                    auVar56._0_8_ = auVar55._0_8_ << 8;
                    auVar56._8_8_ = auVar55._8_8_ << 8 | auVar55._0_8_ >> 0x38;
                    uVar23 = ptr_01[uVar26 + 1] - open;
                    if ((int)uVar23 < -0x7f) {
                      uVar23 = 0xffffff80;
                    }
                    auVar55 = auVar56 | ~auVar43 & ZEXT416(uVar23);
                    bVar39 = true;
                    local_150 = 1;
                    lVar33 = 0;
                    lVar37 = lVar28;
                    do {
                      auVar57 = *(undefined1 (*) [16])((long)*ptr + lVar33);
                      auVar61[0] = -(auVar55[0] < auVar57[0]);
                      auVar61[1] = -(auVar55[1] < auVar57[1]);
                      auVar61[2] = -(auVar55[2] < auVar57[2]);
                      auVar61[3] = -(auVar55[3] < auVar57[3]);
                      auVar61[4] = -(auVar55[4] < auVar57[4]);
                      auVar61[5] = -(auVar55[5] < auVar57[5]);
                      auVar61[6] = -(auVar55[6] < auVar57[6]);
                      auVar61[7] = -(auVar55[7] < auVar57[7]);
                      auVar61[8] = -(auVar55[8] < auVar57[8]);
                      auVar61[9] = -(auVar55[9] < auVar57[9]);
                      auVar61[10] = -(auVar55[10] < auVar57[10]);
                      auVar61[0xb] = -(auVar55[0xb] < auVar57[0xb]);
                      auVar61[0xc] = -(auVar55[0xc] < auVar57[0xc]);
                      auVar61[0xd] = -(auVar55[0xd] < auVar57[0xd]);
                      auVar61[0xe] = -(auVar55[0xe] < auVar57[0xe]);
                      auVar61[0xf] = -(auVar55[0xf] < auVar57[0xf]);
                      auVar57 = ~auVar61 & auVar55 | auVar57 & auVar61;
                      *(undefined1 (*) [16])((long)*ptr + lVar33) = auVar57;
                      piVar15 = ((ppVar24->field_4).rowcols)->score_row;
                      cVar19 = *(char *)((long)*ptr + lVar33 + 1);
                      cVar20 = *(char *)((long)*ptr + lVar33 + 2);
                      cVar46 = *(char *)((long)*ptr + lVar33 + 3);
                      cVar48 = *(char *)((long)*ptr + lVar33 + 4);
                      cVar1 = *(char *)((long)*ptr + lVar33 + 5);
                      cVar2 = *(char *)((long)*ptr + lVar33 + 6);
                      cVar3 = *(char *)((long)*ptr + lVar33 + 7);
                      cVar4 = *(char *)((long)*ptr + lVar33 + 8);
                      cVar5 = *(char *)((long)*ptr + lVar33 + 9);
                      cVar6 = *(char *)((long)*ptr + lVar33 + 10);
                      cVar7 = *(char *)((long)*ptr + lVar33 + 0xb);
                      cVar8 = *(char *)((long)*ptr + lVar33 + 0xc);
                      cVar9 = *(char *)((long)*ptr + lVar33 + 0xd);
                      cVar10 = *(char *)((long)*ptr + lVar33 + 0xe);
                      cVar11 = *(char *)((long)*ptr + lVar33 + 0xf);
                      *(int *)((long)piVar15 + lVar37) = (int)*(char *)((long)*ptr + lVar33);
                      *(int *)((long)piVar15 + lVar35 * 4 + lVar37) = (int)cVar19;
                      *(int *)((long)piVar15 + lVar35 * 8 + lVar37) = (int)cVar20;
                      *(int *)((long)piVar15 + lVar35 * 0xc + lVar37) = (int)cVar46;
                      *(int *)((long)piVar15 + lVar35 * 0x10 + lVar37) = (int)cVar48;
                      *(int *)((long)piVar15 + lVar35 * 0x14 + lVar37) = (int)cVar1;
                      *(int *)((long)piVar15 + lVar35 * 0x18 + lVar37) = (int)cVar2;
                      *(int *)((long)piVar15 + lVar35 * 0x1c + lVar37) = (int)cVar3;
                      *(int *)((long)piVar15 + lVar35 * 0x20 + lVar37) = (int)cVar4;
                      *(int *)((long)piVar15 + lVar35 * 0x24 + lVar37) = (int)cVar5;
                      *(int *)((long)piVar15 + lVar35 * 0x28 + lVar37) = (int)cVar6;
                      *(int *)((long)piVar15 + lVar35 * 0x2c + lVar37) = (int)cVar7;
                      *(int *)((long)piVar15 + lVar35 * 0x30 + lVar37) = (int)cVar8;
                      *(int *)((long)piVar15 + lVar35 * 0x34 + lVar37) = (int)cVar9;
                      *(int *)((long)piVar15 + lVar35 * 0x38 + lVar37) = (int)cVar10;
                      *(int *)((long)piVar15 + lVar35 * 0x3c + lVar37) = (int)cVar11;
                      auVar62[0] = -(auVar57[0] < auVar66[0]);
                      auVar62[1] = -(auVar57[1] < auVar66[1]);
                      auVar62[2] = -(auVar57[2] < auVar66[2]);
                      auVar62[3] = -(auVar57[3] < auVar66[3]);
                      auVar62[4] = -(auVar57[4] < auVar66[4]);
                      auVar62[5] = -(auVar57[5] < auVar66[5]);
                      auVar62[6] = -(auVar57[6] < auVar66[6]);
                      auVar62[7] = -(auVar57[7] < auVar66[7]);
                      auVar62[8] = -(auVar57[8] < auVar66[8]);
                      auVar62[9] = -(auVar57[9] < auVar66[9]);
                      auVar62[10] = -(auVar57[10] < auVar66[10]);
                      auVar62[0xb] = -(auVar57[0xb] < auVar66[0xb]);
                      auVar62[0xc] = -(auVar57[0xc] < auVar66[0xc]);
                      auVar62[0xd] = -(auVar57[0xd] < auVar66[0xd]);
                      auVar62[0xe] = -(auVar57[0xe] < auVar66[0xe]);
                      auVar62[0xf] = -(auVar57[0xf] < auVar66[0xf]);
                      auVar66 = ~auVar62 & auVar66 | auVar57 & auVar62;
                      auVar52[0] = -(auVar57[0] < auVar51[0]);
                      auVar52[1] = -(auVar57[1] < auVar51[1]);
                      auVar52[2] = -(auVar57[2] < auVar51[2]);
                      auVar52[3] = -(auVar57[3] < auVar51[3]);
                      auVar52[4] = -(auVar57[4] < auVar51[4]);
                      auVar52[5] = -(auVar57[5] < auVar51[5]);
                      auVar52[6] = -(auVar57[6] < auVar51[6]);
                      auVar52[7] = -(auVar57[7] < auVar51[7]);
                      auVar52[8] = -(auVar57[8] < auVar51[8]);
                      auVar52[9] = -(auVar57[9] < auVar51[9]);
                      auVar52[10] = -(auVar57[10] < auVar51[10]);
                      auVar52[0xb] = -(auVar57[0xb] < auVar51[0xb]);
                      auVar52[0xc] = -(auVar57[0xc] < auVar51[0xc]);
                      auVar52[0xd] = -(auVar57[0xd] < auVar51[0xd]);
                      auVar52[0xe] = -(auVar57[0xe] < auVar51[0xe]);
                      auVar52[0xf] = -(auVar57[0xf] < auVar51[0xf]);
                      auVar51 = ~auVar52 & auVar57 | auVar51 & auVar52;
                      auVar57 = psubsb(auVar57,auVar50);
                      auVar17._4_4_ = uVar40;
                      auVar17._0_4_ = uVar40;
                      auVar17._8_4_ = uVar40;
                      auVar17._12_4_ = uVar40;
                      auVar55 = psubsb(auVar55,auVar17);
                      auVar63[0] = -(auVar57[0] < auVar55[0]);
                      auVar63[1] = -(auVar57[1] < auVar55[1]);
                      auVar63[2] = -(auVar57[2] < auVar55[2]);
                      auVar63[3] = -(auVar57[3] < auVar55[3]);
                      auVar63[4] = -(auVar57[4] < auVar55[4]);
                      auVar63[5] = -(auVar57[5] < auVar55[5]);
                      auVar63[6] = -(auVar57[6] < auVar55[6]);
                      auVar63[7] = -(auVar57[7] < auVar55[7]);
                      auVar63[8] = -(auVar57[8] < auVar55[8]);
                      auVar63[9] = -(auVar57[9] < auVar55[9]);
                      auVar63[10] = -(auVar57[10] < auVar55[10]);
                      auVar63[0xb] = -(auVar57[0xb] < auVar55[0xb]);
                      auVar63[0xc] = -(auVar57[0xc] < auVar55[0xc]);
                      auVar63[0xd] = -(auVar57[0xd] < auVar55[0xd]);
                      auVar63[0xe] = -(auVar57[0xe] < auVar55[0xe]);
                      auVar63[0xf] = -(auVar57[0xf] < auVar55[0xf]);
                      if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar63 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar63 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar63 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar63 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar63 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar63 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar63 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar63 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar63 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar63 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar63 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar63 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar63 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar63[0xf]) break;
                      bVar39 = local_150 < uVar31;
                      lVar33 = lVar33 + 0x10;
                      lVar37 = lVar37 + uVar34 * 4;
                      local_150 = local_150 + 1;
                    } while (lVar36 != lVar33);
                  } while ((!bVar39) && (bVar39 = uVar12 < 0xf, uVar12 = uVar12 + 1, bVar39));
                  uVar26 = uVar26 + 1;
                  lVar28 = lVar28 + 4;
                  palVar25 = local_180;
                  if (uVar26 == uVar32) {
                    uVar34 = ptr[(uint)(iVar38 % iVar30)][0];
                    uVar31 = ptr[(uint)(iVar38 % iVar30)][1];
                    if (iVar38 / iVar30 < 0xf) {
                      iVar29 = 1;
                      if (1 < iVar22) {
                        iVar29 = iVar22;
                      }
                      do {
                        uVar31 = uVar31 << 8 | uVar34 >> 0x38;
                        iVar29 = iVar29 + -1;
                        uVar34 = uVar34 << 8;
                      } while (iVar29 != 0);
                    }
                    cVar19 = auVar41[0];
                    auVar43[0] = -(auVar66[0] < cVar19);
                    cVar20 = auVar41[1];
                    auVar43[1] = -(auVar66[1] < cVar20);
                    cVar46 = auVar41[2];
                    auVar43[2] = -(auVar66[2] < cVar46);
                    cVar48 = auVar41[3];
                    auVar43[3] = -(auVar66[3] < cVar48);
                    auVar43[4] = -(auVar66[4] < cVar19);
                    auVar43[5] = -(auVar66[5] < cVar20);
                    auVar43[6] = -(auVar66[6] < cVar46);
                    auVar43[7] = -(auVar66[7] < cVar48);
                    auVar43[8] = -(auVar66[8] < cVar19);
                    auVar43[9] = -(auVar66[9] < cVar20);
                    auVar43[10] = -(auVar66[10] < cVar46);
                    auVar43[0xb] = -(auVar66[0xb] < cVar48);
                    auVar43[0xc] = -(auVar66[0xc] < cVar19);
                    auVar43[0xd] = -(auVar66[0xd] < cVar20);
                    auVar43[0xe] = -(auVar66[0xe] < cVar46);
                    auVar43[0xf] = -(auVar66[0xf] < cVar48);
                    cVar19 = auVar49[0];
                    auVar53[0] = -(cVar19 < auVar51[0]);
                    cVar20 = auVar49[1];
                    auVar53[1] = -(cVar20 < auVar51[1]);
                    cVar46 = auVar49[2];
                    auVar53[2] = -(cVar46 < auVar51[2]);
                    cVar48 = auVar49[3];
                    auVar53[3] = -(cVar48 < auVar51[3]);
                    auVar53[4] = -(cVar19 < auVar51[4]);
                    auVar53[5] = -(cVar20 < auVar51[5]);
                    auVar53[6] = -(cVar46 < auVar51[6]);
                    auVar53[7] = -(cVar48 < auVar51[7]);
                    auVar53[8] = -(cVar19 < auVar51[8]);
                    auVar53[9] = -(cVar20 < auVar51[9]);
                    auVar53[10] = -(cVar46 < auVar51[10]);
                    auVar53[0xb] = -(cVar48 < auVar51[0xb]);
                    auVar53[0xc] = -(cVar19 < auVar51[0xc]);
                    auVar53[0xd] = -(cVar20 < auVar51[0xd]);
                    auVar53[0xe] = -(cVar46 < auVar51[0xe]);
                    auVar53[0xf] = -(cVar48 < auVar51[0xf]);
                    auVar53 = auVar53 | auVar43;
                    if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar53 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar53 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar53 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar53 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar53[0xf]) {
                      cVar19 = (char)(uVar31 >> 0x38);
                    }
                    else {
                      *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
                      cVar19 = '\0';
                      iVar21 = 0;
                      iVar38 = 0;
                    }
                    ppVar24->score = (int)cVar19;
                    ppVar24->end_query = iVar38;
                    ppVar24->end_ref = iVar21;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(local_180);
                    parasail_free(ptr);
                    return ppVar24;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}